

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_synth.cpp
# Opt level: O0

bool append_descriptor(vector<VkDescriptorSetLayoutBinding,_std::allocator<VkDescriptorSetLayoutBinding>_>
                       *bindings,vector<unsigned_int,_std::allocator<unsigned_int>_> *binding_flags,
                      uint32_t desc_set,uint32_t binding,VkDescriptorType desc_type,spvc_type type)

{
  FILE *pFVar1;
  uint32_t uVar2;
  VkDescriptorType VVar3;
  spvc_bool sVar4;
  bool bVar5;
  uint uVar6;
  iterator __first;
  iterator __last;
  pointer pVVar7;
  SpvId local_b4;
  value_type_conflict1 local_8c;
  undefined1 local_88 [8];
  VkDescriptorSetLayoutBinding bind;
  SpvId local_68;
  uint32_t desc_count;
  uint num_array_dimensions;
  __normal_iterator<VkDescriptorSetLayoutBinding_*,_std::vector<VkDescriptorSetLayoutBinding,_std::allocator<VkDescriptorSetLayoutBinding>_>_>
  local_48;
  __normal_iterator<VkDescriptorSetLayoutBinding_*,_std::vector<VkDescriptorSetLayoutBinding,_std::allocator<VkDescriptorSetLayoutBinding>_>_>
  itr;
  vector<VkDescriptorSetLayoutBinding,_std::allocator<VkDescriptorSetLayoutBinding>_> *binds;
  spvc_type type_local;
  uint32_t local_28;
  VkDescriptorType desc_type_local;
  uint32_t binding_local;
  uint32_t desc_set_local;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *binding_flags_local;
  vector<VkDescriptorSetLayoutBinding,_std::allocator<VkDescriptorSetLayoutBinding>_>
  *bindings_local;
  
  local_28 = binding;
  desc_type_local = desc_set;
  _binding_local = binding_flags;
  binding_flags_local = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)bindings;
  if (7 < desc_set) {
    fprintf(_stderr,"Fossilize ERROR: Descriptor set %u is out of range.\n",(ulong)desc_set);
    fflush(_stderr);
    return false;
  }
  itr._M_current = (VkDescriptorSetLayoutBinding *)(bindings + desc_set);
  __first = std::vector<VkDescriptorSetLayoutBinding,_std::allocator<VkDescriptorSetLayoutBinding>_>
            ::begin((vector<VkDescriptorSetLayoutBinding,_std::allocator<VkDescriptorSetLayoutBinding>_>
                     *)itr._M_current);
  __last = std::vector<VkDescriptorSetLayoutBinding,_std::allocator<VkDescriptorSetLayoutBinding>_>
           ::end(itr._M_current);
  local_48 = std::
             find_if<__gnu_cxx::__normal_iterator<VkDescriptorSetLayoutBinding*,std::vector<VkDescriptorSetLayoutBinding,std::allocator<VkDescriptorSetLayoutBinding>>>,append_descriptor(std::vector<VkDescriptorSetLayoutBinding,std::allocator<VkDescriptorSetLayoutBinding>>*,std::vector<unsigned_int,std::allocator<unsigned_int>>*,unsigned_int,unsigned_int,VkDescriptorType,spvc_type_s_const*)::__0>
                       (__first._M_current,__last._M_current,
                        (anon_class_8_1_7ce6e165_for__M_pred)&local_28);
  uVar6 = spvc_type_get_num_array_dimensions(type);
  local_68 = 1;
  if (uVar6 == 1) {
    sVar4 = spvc_type_array_dimension_is_literal(type,0);
    if (sVar4 == '\0') {
      fprintf(_stderr,
              "Fossilize ERROR: Array size dimensions of resources must be constant literals.\n");
      fflush(_stderr);
      return false;
    }
    local_68 = spvc_type_get_array_dimension(type,0);
  }
  bind.pImmutableSamplers =
       (VkSampler *)
       std::vector<VkDescriptorSetLayoutBinding,_std::allocator<VkDescriptorSetLayoutBinding>_>::end
                 ((vector<VkDescriptorSetLayoutBinding,_std::allocator<VkDescriptorSetLayoutBinding>_>
                   *)itr._M_current);
  bVar5 = __gnu_cxx::operator!=
                    (&local_48,
                     (__normal_iterator<VkDescriptorSetLayoutBinding_*,_std::vector<VkDescriptorSetLayoutBinding,_std::allocator<VkDescriptorSetLayoutBinding>_>_>
                      *)&bind.pImmutableSamplers);
  if (bVar5) {
    pVVar7 = __gnu_cxx::
             __normal_iterator<VkDescriptorSetLayoutBinding_*,_std::vector<VkDescriptorSetLayoutBinding,_std::allocator<VkDescriptorSetLayoutBinding>_>_>
             ::operator->(&local_48);
    VVar3 = desc_type_local;
    uVar2 = local_28;
    pFVar1 = _stderr;
    if (pVVar7->descriptorType != desc_type) {
      pVVar7 = __gnu_cxx::
               __normal_iterator<VkDescriptorSetLayoutBinding_*,_std::vector<VkDescriptorSetLayoutBinding,_std::allocator<VkDescriptorSetLayoutBinding>_>_>
               ::operator->(&local_48);
      fprintf(pFVar1,
              "Fossilize ERROR: Overlap in descriptor type for binding (%u, %u) (was %u, now %u).\n"
              ,(ulong)VVar3,(ulong)uVar2,(ulong)pVVar7->descriptorType,(ulong)desc_type);
      fflush(_stderr);
      return false;
    }
    if (local_68 == 0) {
      local_68 = 1000000;
    }
    pVVar7 = __gnu_cxx::
             __normal_iterator<VkDescriptorSetLayoutBinding_*,_std::vector<VkDescriptorSetLayoutBinding,_std::allocator<VkDescriptorSetLayoutBinding>_>_>
             ::operator->(&local_48);
    VVar3 = desc_type_local;
    uVar2 = local_28;
    pFVar1 = _stderr;
    if (pVVar7->descriptorCount != local_68) {
      pVVar7 = __gnu_cxx::
               __normal_iterator<VkDescriptorSetLayoutBinding_*,_std::vector<VkDescriptorSetLayoutBinding,_std::allocator<VkDescriptorSetLayoutBinding>_>_>
               ::operator->(&local_48);
      fprintf(pFVar1,"Fossilize ERROR: Descriptor count mismatch for (%u, %u) (was %u, now %u).\n",
              (ulong)VVar3,(ulong)uVar2,(ulong)pVVar7->descriptorCount,(ulong)local_68);
      fflush(_stderr);
      return false;
    }
  }
  else {
    memset(local_88,0,0x18);
    local_88._0_4_ = local_28;
    bind.descriptorType = VK_DESCRIPTOR_TYPE_MAX_ENUM;
    if (local_68 == 0) {
      local_b4 = 1000000;
    }
    else {
      local_b4 = local_68;
    }
    bind.binding = local_b4;
    local_88._4_4_ = desc_type;
    std::vector<VkDescriptorSetLayoutBinding,_std::allocator<VkDescriptorSetLayoutBinding>_>::
    push_back((vector<VkDescriptorSetLayoutBinding,_std::allocator<VkDescriptorSetLayoutBinding>_> *
              )itr._M_current,(value_type *)local_88);
    local_8c = 0;
    if (local_68 == 0) {
      local_8c = 8;
    }
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
              (_binding_local + desc_type_local,&local_8c);
  }
  return true;
}

Assistant:

static bool append_descriptor(std::vector<VkDescriptorSetLayoutBinding> *bindings,
                              std::vector<VkDescriptorBindingFlags> *binding_flags,
                              uint32_t desc_set, uint32_t binding,
                              VkDescriptorType desc_type, spvc_type type)
{
	if (desc_set >= 8)
	{
		LOGE("Descriptor set %u is out of range.\n", desc_set);
		return false;
	}

	auto &binds = bindings[desc_set];

	auto itr = std::find_if(binds.begin(), binds.end(), [&](const VkDescriptorSetLayoutBinding &bind) {
		return bind.binding == binding;
	});

	unsigned num_array_dimensions = spvc_type_get_num_array_dimensions(type);
	uint32_t desc_count = 1;
	if (num_array_dimensions == 1)
	{
		if (!spvc_type_array_dimension_is_literal(type, 0))
		{
			LOGE("Array size dimensions of resources must be constant literals.\n");
			return false;
		}
		desc_count = spvc_type_get_array_dimension(type, 0);
	}

	if (itr != binds.end())
	{
		if (itr->descriptorType != desc_type)
		{
			LOGE("Overlap in descriptor type for binding (%u, %u) (was %u, now %u).\n",
			     desc_set, binding, itr->descriptorType, desc_type);
			return false;
		}

		if (desc_count == 0)
			desc_count = 1000000;

		if (itr->descriptorCount != desc_count)
		{
			LOGE("Descriptor count mismatch for (%u, %u) (was %u, now %u).\n",
			     desc_set, binding, itr->descriptorCount, desc_count);
			return false;
		}
	}
	else
	{
		VkDescriptorSetLayoutBinding bind = {};
		bind.binding = binding;
		bind.stageFlags = VK_SHADER_STAGE_ALL;
		bind.descriptorType = desc_type;
		bind.descriptorCount = desc_count != 0 ? desc_count : 1000000;
		binds.push_back(bind);
		binding_flags[desc_set].push_back(desc_count == 0 ? VK_DESCRIPTOR_BINDING_VARIABLE_DESCRIPTOR_COUNT_BIT : 0);
	}

	return true;
}